

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageOneofFieldGenerator::GenerateMembers
          (MessageOneofFieldGenerator *this,Printer *printer,bool param_2)

{
  bool param_2_local;
  Printer *printer_local;
  MessageOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "public boolean has$capitalized_name$() {\n  return $has_oneof_case$;\n}\npublic $type$ get$capitalized_name$() {\n  if ($has_oneof_case$) {\n    return ($type$) this.$oneof_name$_;\n  }\n  return null;\n}\npublic $message_name$ set$capitalized_name$($type$ value) {\n  if (value == null) { throw new java.lang.NullPointerException(); }\n  $set_oneof_case$;\n  this.$oneof_name$_ = value;\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void MessageOneofFieldGenerator::
GenerateMembers(io::Printer* printer, bool /* unused lazy_init */) const {
  printer->Print(variables_,
    "public boolean has$capitalized_name$() {\n"
    "  return $has_oneof_case$;\n"
    "}\n"
    "public $type$ get$capitalized_name$() {\n"
    "  if ($has_oneof_case$) {\n"
    "    return ($type$) this.$oneof_name$_;\n"
    "  }\n"
    "  return null;\n"
    "}\n"
    "public $message_name$ set$capitalized_name$($type$ value) {\n"
    "  if (value == null) { throw new java.lang.NullPointerException(); }\n"
    "  $set_oneof_case$;\n"
    "  this.$oneof_name$_ = value;\n"
    "  return this;\n"
    "}\n");
}